

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O3

Aig_Man_t * Aig_ManRehash(Aig_Man_t *p)

{
  int iVar1;
  Aig_Man_t *p_00;
  
  if (p->pReprs != (Aig_Obj_t **)0x0) {
    iVar1 = Aig_ManRemapRepr(p);
    while (iVar1 != 0) {
      p_00 = Aig_ManDupRepr(p,1);
      Aig_ManReprStart(p_00,p_00->vObjs->nSize);
      Aig_ManTransferRepr(p_00,p);
      Aig_ManStop(p);
      iVar1 = Aig_ManRemapRepr(p_00);
      p = p_00;
    }
    return p;
  }
  __assert_fail("p->pReprs != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRepr.c"
                ,0x1ca,"Aig_Man_t *Aig_ManRehash(Aig_Man_t *)");
}

Assistant:

Aig_Man_t * Aig_ManRehash( Aig_Man_t * p )
{
    Aig_Man_t * pTemp;
    int i, nFanouts;
    assert( p->pReprs != NULL );
    for ( i = 0; (nFanouts = Aig_ManRemapRepr( p )); i++ )
    {
//        printf( "Iter = %3d. Fanouts = %6d. Nodes = %7d.\n", i+1, nFanouts, Aig_ManNodeNum(p) );
        p = Aig_ManDupRepr( pTemp = p, 1 );
        Aig_ManReprStart( p, Aig_ManObjNumMax(p) );
        Aig_ManTransferRepr( p, pTemp );
        Aig_ManStop( pTemp );
    }
    return p;
}